

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  Scene *pSVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  Geometry *pGVar9;
  RTCIntersectArguments *pRVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  bool bVar28;
  undefined1 auVar29 [16];
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  int iVar35;
  ulong uVar36;
  ulong uVar37;
  undefined4 uVar38;
  ulong unaff_R12;
  size_t mask;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  bool bVar42;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar66 [16];
  float fVar76;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar88;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar99;
  float fVar100;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar102;
  undefined1 auVar95 [16];
  float fVar101;
  float fVar103;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  float fVar115;
  float fVar116;
  float fVar121;
  float fVar123;
  undefined1 auVar117 [16];
  float fVar125;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar122;
  float fVar124;
  float fVar126;
  undefined1 auVar120 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar134 [16];
  float fVar135;
  float fVar137;
  float fVar138;
  undefined1 auVar136 [16];
  float fVar139;
  float fVar140;
  float fVar143;
  float fVar144;
  undefined1 auVar141 [16];
  float fVar145;
  undefined1 auVar142 [16];
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  UVIdentity<4> mapUV;
  Scene *scene;
  int local_15ac;
  undefined1 local_15a8 [16];
  undefined8 local_1598;
  float fStack_1590;
  float fStack_158c;
  ulong local_1580;
  NodeRef *local_1578;
  ulong local_1570;
  ulong local_1568;
  ulong local_1560;
  ulong local_1558;
  ulong local_1550;
  ulong local_1548;
  ulong local_1540;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined1 local_13c8 [16];
  undefined1 local_13b8 [16];
  undefined1 local_13a8 [16];
  UVIdentity<4> *local_1398;
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  undefined1 local_1318 [32];
  undefined1 local_12f8 [32];
  undefined1 local_12d8 [8];
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  float fStack_12c0;
  undefined1 local_12b8 [8];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float fStack_12a0;
  undefined1 local_1298 [8];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float fStack_1280;
  undefined1 local_1278 [8];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  float fStack_1260;
  undefined1 local_1258 [8];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  float fStack_1240;
  undefined1 local_1238 [8];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  float fStack_1220;
  undefined4 local_1218;
  undefined4 uStack_1214;
  undefined4 uStack_1210;
  undefined4 uStack_120c;
  undefined4 uStack_1208;
  undefined4 uStack_1204;
  undefined4 uStack_1200;
  undefined4 uStack_11fc;
  undefined4 local_11f8;
  undefined4 uStack_11f4;
  undefined4 uStack_11f0;
  undefined4 uStack_11ec;
  undefined4 uStack_11e8;
  undefined4 uStack_11e4;
  undefined4 uStack_11e0;
  undefined4 uStack_11dc;
  NodeRef stack [564];
  
  auVar29 = mm_lookupmask_ps._240_16_;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar78 = ray->tfar;
    if (0.0 <= fVar78) {
      local_1578 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      aVar2 = (ray->dir).field_0;
      auVar107 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar80._8_4_ = 0x7fffffff;
      auVar80._0_8_ = 0x7fffffff7fffffff;
      auVar80._12_4_ = 0x7fffffff;
      auVar80 = vandps_avx((undefined1  [16])aVar2,auVar80);
      auVar92._8_4_ = 0x219392ef;
      auVar92._0_8_ = 0x219392ef219392ef;
      auVar92._12_4_ = 0x219392ef;
      auVar80 = vcmpps_avx(auVar80,auVar92,1);
      auVar108._8_4_ = 0x3f800000;
      auVar108._0_8_ = &DAT_3f8000003f800000;
      auVar108._12_4_ = 0x3f800000;
      auVar92 = vdivps_avx(auVar108,(undefined1  [16])aVar2);
      auVar93._8_4_ = 0x5d5e0b6b;
      auVar93._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar93._12_4_ = 0x5d5e0b6b;
      auVar80 = vblendvps_avx(auVar92,auVar93,auVar80);
      auVar81._0_4_ = auVar80._0_4_ * 0.99999964;
      auVar81._4_4_ = auVar80._4_4_ * 0.99999964;
      auVar81._8_4_ = auVar80._8_4_ * 0.99999964;
      auVar81._12_4_ = auVar80._12_4_ * 0.99999964;
      uVar38 = *(undefined4 *)&(ray->org).field_0;
      auVar114._4_4_ = uVar38;
      auVar114._0_4_ = uVar38;
      auVar114._8_4_ = uVar38;
      auVar114._12_4_ = uVar38;
      auVar114._16_4_ = uVar38;
      auVar114._20_4_ = uVar38;
      auVar114._24_4_ = uVar38;
      auVar114._28_4_ = uVar38;
      local_11f8 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      uStack_11f4 = local_11f8;
      uStack_11f0 = local_11f8;
      uStack_11ec = local_11f8;
      uStack_11e8 = local_11f8;
      uStack_11e4 = local_11f8;
      uStack_11e0 = local_11f8;
      uStack_11dc = local_11f8;
      local_1218 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      uStack_1214 = local_1218;
      uStack_1210 = local_1218;
      uStack_120c = local_1218;
      uStack_1208 = local_1218;
      uStack_1204 = local_1218;
      uStack_1200 = local_1218;
      uStack_11fc = local_1218;
      auVar94._0_4_ = auVar80._0_4_ * 1.0000004;
      auVar94._4_4_ = auVar80._4_4_ * 1.0000004;
      auVar94._8_4_ = auVar80._8_4_ * 1.0000004;
      auVar94._12_4_ = auVar80._12_4_ * 1.0000004;
      auVar80 = vshufps_avx(auVar81,auVar81,0);
      register0x000012d0 = auVar80;
      _local_1238 = auVar80;
      auVar80 = vmovshdup_avx(auVar81);
      auVar92 = vshufps_avx(auVar81,auVar81,0x55);
      register0x000012d0 = auVar92;
      _local_1258 = auVar92;
      auVar92 = vshufpd_avx(auVar81,auVar81,1);
      auVar108 = vshufps_avx(auVar81,auVar81,0xaa);
      register0x00001310 = auVar108;
      _local_1278 = auVar108;
      auVar108 = vshufps_avx(auVar94,auVar94,0);
      register0x00001310 = auVar108;
      _local_1298 = auVar108;
      local_1580 = (ulong)(auVar81._0_4_ < 0.0) << 5;
      auVar108 = vshufps_avx(auVar94,auVar94,0x55);
      register0x00001310 = auVar108;
      _local_12b8 = auVar108;
      auVar108 = vshufps_avx(auVar94,auVar94,0xaa);
      register0x00001310 = auVar108;
      _local_12d8 = auVar108;
      uVar36 = (ulong)(auVar80._0_4_ < 0.0) << 5 | 0x40;
      uVar37 = (ulong)(auVar92._0_4_ < 0.0) << 5 | 0x80;
      uVar40 = local_1580 ^ 0x20;
      uVar41 = uVar36 ^ 0x20;
      local_1570 = uVar37 ^ 0x20;
      auVar80 = vshufps_avx(auVar107,auVar107,0);
      local_12f8._16_16_ = auVar80;
      local_12f8._0_16_ = auVar80;
      auVar80 = vshufps_avx(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78),0);
      local_1318._16_16_ = auVar80;
      local_1318._0_16_ = auVar80;
      uVar39 = local_1570;
      local_1568 = uVar41;
      local_1560 = uVar40;
      local_1558 = uVar37;
      local_1550 = uVar36;
      do {
        if (local_1578 == stack) {
          return;
        }
        uVar34 = local_1578[-1].ptr;
        local_1578 = local_1578 + -1;
        do {
          if ((uVar34 & 8) == 0) {
            auVar19 = vsubps_avx(*(undefined1 (*) [32])(uVar34 + 0x40 + local_1580),auVar114);
            auVar20._4_4_ = auVar19._4_4_ * (float)local_1238._4_4_;
            auVar20._0_4_ = auVar19._0_4_ * (float)local_1238._0_4_;
            auVar20._8_4_ = auVar19._8_4_ * fStack_1230;
            auVar20._12_4_ = auVar19._12_4_ * fStack_122c;
            auVar20._16_4_ = auVar19._16_4_ * fStack_1228;
            auVar20._20_4_ = auVar19._20_4_ * fStack_1224;
            auVar20._24_4_ = auVar19._24_4_ * fStack_1220;
            auVar20._28_4_ = auVar19._28_4_;
            auVar27._4_4_ = uStack_11f4;
            auVar27._0_4_ = local_11f8;
            auVar27._8_4_ = uStack_11f0;
            auVar27._12_4_ = uStack_11ec;
            auVar27._16_4_ = uStack_11e8;
            auVar27._20_4_ = uStack_11e4;
            auVar27._24_4_ = uStack_11e0;
            auVar27._28_4_ = uStack_11dc;
            auVar19 = vsubps_avx(*(undefined1 (*) [32])(uVar34 + 0x40 + uVar36),auVar27);
            auVar21._4_4_ = auVar19._4_4_ * (float)local_1258._4_4_;
            auVar21._0_4_ = auVar19._0_4_ * (float)local_1258._0_4_;
            auVar21._8_4_ = auVar19._8_4_ * fStack_1250;
            auVar21._12_4_ = auVar19._12_4_ * fStack_124c;
            auVar21._16_4_ = auVar19._16_4_ * fStack_1248;
            auVar21._20_4_ = auVar19._20_4_ * fStack_1244;
            auVar21._24_4_ = auVar19._24_4_ * fStack_1240;
            auVar21._28_4_ = auVar19._28_4_;
            auVar19 = vmaxps_avx(auVar20,auVar21);
            auVar26._4_4_ = uStack_1214;
            auVar26._0_4_ = local_1218;
            auVar26._8_4_ = uStack_1210;
            auVar26._12_4_ = uStack_120c;
            auVar26._16_4_ = uStack_1208;
            auVar26._20_4_ = uStack_1204;
            auVar26._24_4_ = uStack_1200;
            auVar26._28_4_ = uStack_11fc;
            auVar20 = vsubps_avx(*(undefined1 (*) [32])(uVar34 + 0x40 + uVar37),auVar26);
            auVar22._4_4_ = auVar20._4_4_ * (float)local_1278._4_4_;
            auVar22._0_4_ = auVar20._0_4_ * (float)local_1278._0_4_;
            auVar22._8_4_ = auVar20._8_4_ * fStack_1270;
            auVar22._12_4_ = auVar20._12_4_ * fStack_126c;
            auVar22._16_4_ = auVar20._16_4_ * fStack_1268;
            auVar22._20_4_ = auVar20._20_4_ * fStack_1264;
            auVar22._24_4_ = auVar20._24_4_ * fStack_1260;
            auVar22._28_4_ = auVar20._28_4_;
            auVar20 = vmaxps_avx(auVar22,local_12f8);
            auVar19 = vmaxps_avx(auVar19,auVar20);
            auVar20 = vsubps_avx(*(undefined1 (*) [32])(uVar34 + 0x40 + uVar40),auVar114);
            auVar23._4_4_ = auVar20._4_4_ * (float)local_1298._4_4_;
            auVar23._0_4_ = auVar20._0_4_ * (float)local_1298._0_4_;
            auVar23._8_4_ = auVar20._8_4_ * fStack_1290;
            auVar23._12_4_ = auVar20._12_4_ * fStack_128c;
            auVar23._16_4_ = auVar20._16_4_ * fStack_1288;
            auVar23._20_4_ = auVar20._20_4_ * fStack_1284;
            auVar23._24_4_ = auVar20._24_4_ * fStack_1280;
            auVar23._28_4_ = auVar20._28_4_;
            auVar20 = vsubps_avx(*(undefined1 (*) [32])(uVar34 + 0x40 + uVar41),auVar27);
            auVar24._4_4_ = auVar20._4_4_ * (float)local_12b8._4_4_;
            auVar24._0_4_ = auVar20._0_4_ * (float)local_12b8._0_4_;
            auVar24._8_4_ = auVar20._8_4_ * fStack_12b0;
            auVar24._12_4_ = auVar20._12_4_ * fStack_12ac;
            auVar24._16_4_ = auVar20._16_4_ * fStack_12a8;
            auVar24._20_4_ = auVar20._20_4_ * fStack_12a4;
            auVar24._24_4_ = auVar20._24_4_ * fStack_12a0;
            auVar24._28_4_ = auVar20._28_4_;
            auVar20 = vminps_avx(auVar23,auVar24);
            auVar21 = vsubps_avx(*(undefined1 (*) [32])(uVar34 + 0x40 + uVar39),auVar26);
            auVar25._4_4_ = auVar21._4_4_ * (float)local_12d8._4_4_;
            auVar25._0_4_ = auVar21._0_4_ * (float)local_12d8._0_4_;
            auVar25._8_4_ = auVar21._8_4_ * fStack_12d0;
            auVar25._12_4_ = auVar21._12_4_ * fStack_12cc;
            auVar25._16_4_ = auVar21._16_4_ * fStack_12c8;
            auVar25._20_4_ = auVar21._20_4_ * fStack_12c4;
            auVar25._24_4_ = auVar21._24_4_ * fStack_12c0;
            auVar25._28_4_ = auVar21._28_4_;
            auVar21 = vminps_avx(auVar25,local_1318);
            auVar20 = vminps_avx(auVar20,auVar21);
            auVar19 = vcmpps_avx(auVar19,auVar20,2);
            uVar38 = vmovmskps_avx(auVar19);
            unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar38);
          }
          if ((uVar34 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar35 = 4;
            }
            else {
              uVar33 = uVar34 & 0xfffffffffffffff0;
              lVar31 = 0;
              if (unaff_R12 != 0) {
                for (; (unaff_R12 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
                }
              }
              iVar35 = 0;
              uVar34 = *(ulong *)(uVar33 + lVar31 * 8);
              uVar32 = unaff_R12 - 1 & unaff_R12;
              if (uVar32 != 0) {
                local_1578->ptr = uVar34;
                lVar31 = 0;
                if (uVar32 != 0) {
                  for (; (uVar32 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
                  }
                }
                uVar30 = uVar32 - 1;
                while( true ) {
                  local_1578 = local_1578 + 1;
                  uVar34 = *(ulong *)(uVar33 + lVar31 * 8);
                  uVar30 = uVar30 & uVar32;
                  if (uVar30 == 0) break;
                  local_1578->ptr = uVar34;
                  lVar31 = 0;
                  if (uVar30 != 0) {
                    for (; (uVar30 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
                    }
                  }
                  uVar32 = uVar30 - 1;
                }
              }
            }
          }
          else {
            iVar35 = 6;
          }
        } while (iVar35 == 0);
        uVar33 = uVar39;
        if (iVar35 == 6) {
          iVar35 = 0;
          local_1548 = (ulong)((uint)uVar34 & 0xf) - 8;
          bVar42 = local_1548 != 0;
          if (bVar42) {
            uVar34 = uVar34 & 0xfffffffffffffff0;
            pSVar3 = context->scene;
            local_1540 = 0;
            do {
              lVar31 = local_1540 * 0x50;
              ppfVar4 = (pSVar3->vertices).items;
              pfVar5 = ppfVar4[*(uint *)(uVar34 + 0x30 + lVar31)];
              pfVar6 = ppfVar4[*(uint *)(uVar34 + 0x34 + lVar31)];
              pfVar7 = ppfVar4[*(uint *)(uVar34 + 0x38 + lVar31)];
              pfVar8 = ppfVar4[*(uint *)(uVar34 + 0x3c + lVar31)];
              auVar107 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar34 + lVar31)),
                                       *(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar34 + 8 + lVar31)));
              auVar80 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar34 + lVar31)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar34 + 8 + lVar31)));
              auVar108 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar34 + 4 + lVar31)),
                                       *(undefined1 (*) [16])
                                        (pfVar8 + *(uint *)(uVar34 + 0xc + lVar31)));
              auVar92 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar34 + 4 + lVar31)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar34 + 0xc + lVar31)));
              auVar93 = vunpcklps_avx(auVar80,auVar92);
              auVar94 = vunpcklps_avx(auVar107,auVar108);
              auVar92 = vunpckhps_avx(auVar107,auVar108);
              auVar108 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar5 + *(uint *)(uVar34 + 0x10 + lVar31)),
                                       *(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar34 + 0x18 + lVar31)));
              auVar80 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar34 + 0x10 + lVar31)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar34 + 0x18 + lVar31)));
              auVar81 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar34 + 0x14 + lVar31)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar34 + 0x1c + lVar31)));
              auVar107 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar34 + 0x14 + lVar31)),
                                       *(undefined1 (*) [16])
                                        (pfVar8 + *(uint *)(uVar34 + 0x1c + lVar31)));
              auVar50 = vunpcklps_avx(auVar80,auVar107);
              auVar56 = vunpcklps_avx(auVar108,auVar81);
              auVar81 = vunpckhps_avx(auVar108,auVar81);
              auVar108 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar5 + *(uint *)(uVar34 + 0x20 + lVar31)),
                                       *(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar34 + 0x28 + lVar31)));
              auVar80 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar34 + 0x20 + lVar31)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar34 + 0x28 + lVar31)));
              auVar43 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar34 + 0x24 + lVar31)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar34 + 0x2c + lVar31)));
              auVar107 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar34 + 0x24 + lVar31)),
                                       *(undefined1 (*) [16])
                                        (pfVar8 + *(uint *)(uVar34 + 0x2c + lVar31)));
              auVar57 = vunpcklps_avx(auVar80,auVar107);
              auVar58 = vunpcklps_avx(auVar108,auVar43);
              auVar43 = vunpckhps_avx(auVar108,auVar43);
              puVar1 = (undefined8 *)(uVar34 + 0x30 + lVar31);
              local_13d8 = *puVar1;
              uStack_13d0 = puVar1[1];
              puVar1 = (undefined8 *)(uVar34 + 0x40 + lVar31);
              local_13e8 = *puVar1;
              uStack_13e0 = puVar1[1];
              uVar38 = *(undefined4 *)&(ray->org).field_0;
              auVar127._4_4_ = uVar38;
              auVar127._0_4_ = uVar38;
              auVar127._8_4_ = uVar38;
              auVar127._12_4_ = uVar38;
              uVar38 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar136._4_4_ = uVar38;
              auVar136._0_4_ = uVar38;
              auVar136._8_4_ = uVar38;
              auVar136._12_4_ = uVar38;
              uVar38 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar141._4_4_ = uVar38;
              auVar141._0_4_ = uVar38;
              auVar141._8_4_ = uVar38;
              auVar141._12_4_ = uVar38;
              auVar80 = vsubps_avx(auVar94,auVar127);
              auVar92 = vsubps_avx(auVar92,auVar136);
              auVar107 = vsubps_avx(auVar93,auVar141);
              auVar108 = vsubps_avx(auVar56,auVar127);
              auVar81 = vsubps_avx(auVar81,auVar136);
              auVar93 = vsubps_avx(auVar50,auVar141);
              auVar94 = vsubps_avx(auVar58,auVar127);
              auVar43 = vsubps_avx(auVar43,auVar136);
              auVar50 = vsubps_avx(auVar57,auVar141);
              auVar56 = vsubps_avx(auVar94,auVar80);
              auVar57 = vsubps_avx(auVar43,auVar92);
              auVar58 = vsubps_avx(auVar50,auVar107);
              fVar11 = auVar92._0_4_;
              fVar78 = auVar43._0_4_ + fVar11;
              fVar73 = auVar92._4_4_;
              fVar84 = auVar43._4_4_ + fVar73;
              fVar13 = auVar92._8_4_;
              fVar86 = auVar43._8_4_ + fVar13;
              fVar16 = auVar92._12_4_;
              fVar88 = auVar43._12_4_ + fVar16;
              fVar12 = auVar107._0_4_;
              fVar90 = auVar50._0_4_ + fVar12;
              fVar75 = auVar107._4_4_;
              fVar99 = auVar50._4_4_ + fVar75;
              fVar14 = auVar107._8_4_;
              fVar100 = auVar50._8_4_ + fVar14;
              fVar17 = auVar107._12_4_;
              fVar102 = auVar50._12_4_ + fVar17;
              fVar64 = auVar58._0_4_;
              auVar117._0_4_ = fVar64 * fVar78;
              fVar47 = auVar58._4_4_;
              auVar117._4_4_ = fVar47 * fVar84;
              fVar48 = auVar58._8_4_;
              auVar117._8_4_ = fVar48 * fVar86;
              fVar49 = auVar58._12_4_;
              auVar117._12_4_ = fVar49 * fVar88;
              fVar146 = auVar57._0_4_;
              auVar128._0_4_ = fVar146 * fVar90;
              fVar147 = auVar57._4_4_;
              auVar128._4_4_ = fVar147 * fVar99;
              fVar148 = auVar57._8_4_;
              auVar128._8_4_ = fVar148 * fVar100;
              fVar149 = auVar57._12_4_;
              auVar128._12_4_ = fVar149 * fVar102;
              auVar57 = vsubps_avx(auVar128,auVar117);
              fVar65 = auVar80._0_4_;
              fVar115 = auVar94._0_4_ + fVar65;
              fVar77 = auVar80._4_4_;
              fVar121 = auVar94._4_4_ + fVar77;
              fVar15 = auVar80._8_4_;
              fVar123 = auVar94._8_4_ + fVar15;
              fVar18 = auVar80._12_4_;
              fVar125 = auVar94._12_4_ + fVar18;
              fVar140 = auVar56._0_4_;
              auVar95._0_4_ = fVar140 * fVar90;
              fVar143 = auVar56._4_4_;
              auVar95._4_4_ = fVar143 * fVar99;
              fVar144 = auVar56._8_4_;
              auVar95._8_4_ = fVar144 * fVar100;
              fVar145 = auVar56._12_4_;
              auVar95._12_4_ = fVar145 * fVar102;
              auVar129._0_4_ = fVar115 * fVar64;
              auVar129._4_4_ = fVar121 * fVar47;
              auVar129._8_4_ = fVar123 * fVar48;
              auVar129._12_4_ = fVar125 * fVar49;
              auVar56 = vsubps_avx(auVar129,auVar95);
              auVar118._0_4_ = fVar146 * fVar115;
              auVar118._4_4_ = fVar147 * fVar121;
              auVar118._8_4_ = fVar148 * fVar123;
              auVar118._12_4_ = fVar149 * fVar125;
              auVar82._0_4_ = fVar140 * fVar78;
              auVar82._4_4_ = fVar143 * fVar84;
              auVar82._8_4_ = fVar144 * fVar86;
              auVar82._12_4_ = fVar145 * fVar88;
              auVar58 = vsubps_avx(auVar82,auVar118);
              fVar78 = (ray->dir).field_0.m128[2];
              local_1598._4_4_ = (ray->dir).field_0.m128[1];
              fVar84 = (ray->dir).field_0.m128[0];
              local_15a8._0_4_ =
                   auVar57._0_4_ * fVar84 +
                   local_1598._4_4_ * auVar56._0_4_ + fVar78 * auVar58._0_4_;
              local_15a8._4_4_ =
                   auVar57._4_4_ * fVar84 +
                   local_1598._4_4_ * auVar56._4_4_ + fVar78 * auVar58._4_4_;
              local_15a8._8_4_ =
                   auVar57._8_4_ * fVar84 +
                   local_1598._4_4_ * auVar56._8_4_ + fVar78 * auVar58._8_4_;
              local_15a8._12_4_ =
                   auVar57._12_4_ * fVar84 +
                   local_1598._4_4_ * auVar56._12_4_ + fVar78 * auVar58._12_4_;
              auVar92 = vsubps_avx(auVar92,auVar81);
              auVar107 = vsubps_avx(auVar107,auVar93);
              fVar88 = fVar11 + auVar81._0_4_;
              fVar99 = fVar73 + auVar81._4_4_;
              fVar102 = fVar13 + auVar81._8_4_;
              fVar121 = fVar16 + auVar81._12_4_;
              fVar123 = auVar93._0_4_ + fVar12;
              fVar125 = auVar93._4_4_ + fVar75;
              fVar101 = auVar93._8_4_ + fVar14;
              fVar103 = auVar93._12_4_ + fVar17;
              fVar130 = auVar107._0_4_;
              auVar142._0_4_ = fVar130 * fVar88;
              fVar131 = auVar107._4_4_;
              auVar142._4_4_ = fVar131 * fVar99;
              fVar132 = auVar107._8_4_;
              auVar142._8_4_ = fVar132 * fVar102;
              fVar133 = auVar107._12_4_;
              auVar142._12_4_ = fVar133 * fVar121;
              fVar86 = auVar92._0_4_;
              auVar66._0_4_ = fVar86 * fVar123;
              fVar90 = auVar92._4_4_;
              auVar66._4_4_ = fVar90 * fVar125;
              fVar100 = auVar92._8_4_;
              auVar66._8_4_ = fVar100 * fVar101;
              fVar115 = auVar92._12_4_;
              auVar66._12_4_ = fVar115 * fVar103;
              auVar92 = vsubps_avx(auVar66,auVar142);
              auVar80 = vsubps_avx(auVar80,auVar108);
              fVar135 = auVar80._0_4_;
              auVar96._0_4_ = fVar135 * fVar123;
              fVar137 = auVar80._4_4_;
              auVar96._4_4_ = fVar137 * fVar125;
              fVar138 = auVar80._8_4_;
              auVar96._8_4_ = fVar138 * fVar101;
              fVar139 = auVar80._12_4_;
              auVar96._12_4_ = fVar139 * fVar103;
              fVar123 = auVar108._0_4_ + fVar65;
              fVar125 = auVar108._4_4_ + fVar77;
              fVar101 = auVar108._8_4_ + fVar15;
              fVar103 = auVar108._12_4_ + fVar18;
              auVar119._0_4_ = fVar130 * fVar123;
              auVar119._4_4_ = fVar131 * fVar125;
              auVar119._8_4_ = fVar132 * fVar101;
              auVar119._12_4_ = fVar133 * fVar103;
              auVar80 = vsubps_avx(auVar119,auVar96);
              auVar109._0_4_ = fVar86 * fVar123;
              auVar109._4_4_ = fVar90 * fVar125;
              auVar109._8_4_ = fVar100 * fVar101;
              auVar109._12_4_ = fVar115 * fVar103;
              auVar83._0_4_ = fVar135 * fVar88;
              auVar83._4_4_ = fVar137 * fVar99;
              auVar83._8_4_ = fVar138 * fVar102;
              auVar83._12_4_ = fVar139 * fVar121;
              auVar107 = vsubps_avx(auVar83,auVar109);
              local_13b8._0_4_ =
                   fVar84 * auVar92._0_4_ +
                   local_1598._4_4_ * auVar80._0_4_ + fVar78 * auVar107._0_4_;
              local_13b8._4_4_ =
                   fVar84 * auVar92._4_4_ +
                   local_1598._4_4_ * auVar80._4_4_ + fVar78 * auVar107._4_4_;
              local_13b8._8_4_ =
                   fVar84 * auVar92._8_4_ +
                   local_1598._4_4_ * auVar80._8_4_ + fVar78 * auVar107._8_4_;
              local_13b8._12_4_ =
                   fVar84 * auVar92._12_4_ +
                   local_1598._4_4_ * auVar80._12_4_ + fVar78 * auVar107._12_4_;
              auVar80 = vsubps_avx(auVar108,auVar94);
              fVar63 = auVar108._0_4_ + auVar94._0_4_;
              fVar72 = auVar108._4_4_ + auVar94._4_4_;
              fVar74 = auVar108._8_4_ + auVar94._8_4_;
              fVar76 = auVar108._12_4_ + auVar94._12_4_;
              auVar92 = vsubps_avx(auVar81,auVar43);
              fVar123 = auVar43._0_4_ + auVar81._0_4_;
              fVar125 = auVar43._4_4_ + auVar81._4_4_;
              fVar101 = auVar43._8_4_ + auVar81._8_4_;
              fVar103 = auVar43._12_4_ + auVar81._12_4_;
              auVar107 = vsubps_avx(auVar93,auVar50);
              fVar88 = auVar93._0_4_ + auVar50._0_4_;
              fVar99 = auVar93._4_4_ + auVar50._4_4_;
              fVar102 = auVar93._8_4_ + auVar50._8_4_;
              fVar121 = auVar93._12_4_ + auVar50._12_4_;
              fVar79 = auVar107._0_4_;
              auVar50._0_4_ = fVar79 * fVar123;
              fVar85 = auVar107._4_4_;
              auVar50._4_4_ = fVar85 * fVar125;
              fVar87 = auVar107._8_4_;
              auVar50._8_4_ = fVar87 * fVar101;
              fVar89 = auVar107._12_4_;
              auVar50._12_4_ = fVar89 * fVar103;
              fVar116 = auVar92._0_4_;
              auVar110._0_4_ = fVar116 * fVar88;
              fVar122 = auVar92._4_4_;
              auVar110._4_4_ = fVar122 * fVar99;
              fVar124 = auVar92._8_4_;
              auVar110._8_4_ = fVar124 * fVar102;
              fVar126 = auVar92._12_4_;
              auVar110._12_4_ = fVar126 * fVar121;
              auVar92 = vsubps_avx(auVar110,auVar50);
              fVar91 = auVar80._0_4_;
              auVar107._0_4_ = fVar91 * fVar88;
              fVar88 = auVar80._4_4_;
              auVar107._4_4_ = fVar88 * fVar99;
              fVar99 = auVar80._8_4_;
              auVar107._8_4_ = fVar99 * fVar102;
              fVar102 = auVar80._12_4_;
              auVar107._12_4_ = fVar102 * fVar121;
              auVar111._0_4_ = fVar79 * fVar63;
              auVar111._4_4_ = fVar85 * fVar72;
              auVar111._8_4_ = fVar87 * fVar74;
              auVar111._12_4_ = fVar89 * fVar76;
              auVar80 = vsubps_avx(auVar111,auVar107);
              auVar67._0_4_ = fVar116 * fVar63;
              auVar67._4_4_ = fVar122 * fVar72;
              auVar67._8_4_ = fVar124 * fVar74;
              auVar67._12_4_ = fVar126 * fVar76;
              auVar56._0_4_ = fVar91 * fVar123;
              auVar56._4_4_ = fVar88 * fVar125;
              auVar56._8_4_ = fVar99 * fVar101;
              auVar56._12_4_ = fVar102 * fVar103;
              auVar107 = vsubps_avx(auVar56,auVar67);
              local_1598._0_4_ = local_1598._4_4_;
              fStack_1590 = local_1598._4_4_;
              fStack_158c = local_1598._4_4_;
              auVar43._0_4_ =
                   fVar84 * auVar92._0_4_ +
                   local_1598._4_4_ * auVar80._0_4_ + fVar78 * auVar107._0_4_;
              auVar43._4_4_ =
                   fVar84 * auVar92._4_4_ +
                   local_1598._4_4_ * auVar80._4_4_ + fVar78 * auVar107._4_4_;
              auVar43._8_4_ =
                   fVar84 * auVar92._8_4_ +
                   local_1598._4_4_ * auVar80._8_4_ + fVar78 * auVar107._8_4_;
              auVar43._12_4_ =
                   fVar84 * auVar92._12_4_ +
                   local_1598._4_4_ * auVar80._12_4_ + fVar78 * auVar107._12_4_;
              local_13a8._0_4_ = auVar43._0_4_ + local_15a8._0_4_ + local_13b8._0_4_;
              local_13a8._4_4_ = auVar43._4_4_ + local_15a8._4_4_ + local_13b8._4_4_;
              local_13a8._8_4_ = auVar43._8_4_ + local_15a8._8_4_ + local_13b8._8_4_;
              local_13a8._12_4_ = auVar43._12_4_ + local_15a8._12_4_ + local_13b8._12_4_;
              auVar80 = vminps_avx(local_15a8,local_13b8);
              auVar92 = vminps_avx(auVar80,auVar43);
              auVar57._8_4_ = 0x7fffffff;
              auVar57._0_8_ = 0x7fffffff7fffffff;
              auVar57._12_4_ = 0x7fffffff;
              auVar80 = vandps_avx(local_13a8,auVar57);
              auVar58._0_4_ = auVar80._0_4_ * 1.1920929e-07;
              auVar58._4_4_ = auVar80._4_4_ * 1.1920929e-07;
              auVar58._8_4_ = auVar80._8_4_ * 1.1920929e-07;
              auVar58._12_4_ = auVar80._12_4_ * 1.1920929e-07;
              uVar36 = CONCAT44(auVar58._4_4_,auVar58._0_4_);
              auVar68._0_8_ = uVar36 ^ 0x8000000080000000;
              auVar68._8_4_ = -auVar58._8_4_;
              auVar68._12_4_ = -auVar58._12_4_;
              auVar92 = vcmpps_avx(auVar92,auVar68,5);
              auVar107 = vmaxps_avx(local_15a8,local_13b8);
              auVar107 = vmaxps_avx(auVar107,auVar43);
              auVar107 = vcmpps_avx(auVar107,auVar58,2);
              auVar92 = vorps_avx(auVar92,auVar107);
              mapUV = (UVIdentity<4>)0x0;
              local_1398 = &mapUV;
              auVar107 = auVar29 & auVar92;
              if ((((auVar107 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar107 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar107 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar107[0xf] < '\0') {
                auVar44._0_4_ = fVar86 * fVar64;
                auVar44._4_4_ = fVar90 * fVar47;
                auVar44._8_4_ = fVar100 * fVar48;
                auVar44._12_4_ = fVar115 * fVar49;
                auVar51._0_4_ = fVar146 * fVar130;
                auVar51._4_4_ = fVar147 * fVar131;
                auVar51._8_4_ = fVar148 * fVar132;
                auVar51._12_4_ = fVar149 * fVar133;
                auVar81 = vsubps_avx(auVar51,auVar44);
                auVar59._0_4_ = fVar130 * fVar116;
                auVar59._4_4_ = fVar131 * fVar122;
                auVar59._8_4_ = fVar132 * fVar124;
                auVar59._12_4_ = fVar133 * fVar126;
                auVar69._0_4_ = fVar86 * fVar79;
                auVar69._4_4_ = fVar90 * fVar85;
                auVar69._8_4_ = fVar100 * fVar87;
                auVar69._12_4_ = fVar115 * fVar89;
                auVar93 = vsubps_avx(auVar69,auVar59);
                auVar134._8_4_ = 0x7fffffff;
                auVar134._0_8_ = 0x7fffffff7fffffff;
                auVar134._12_4_ = 0x7fffffff;
                auVar107 = vandps_avx(auVar134,auVar44);
                auVar108 = vandps_avx(auVar134,auVar59);
                auVar107 = vcmpps_avx(auVar107,auVar108,1);
                local_1348 = vblendvps_avx(auVar93,auVar81,auVar107);
                auVar52._0_4_ = fVar135 * fVar79;
                auVar52._4_4_ = fVar137 * fVar85;
                auVar52._8_4_ = fVar138 * fVar87;
                auVar52._12_4_ = fVar139 * fVar89;
                auVar60._0_4_ = fVar135 * fVar64;
                auVar60._4_4_ = fVar137 * fVar47;
                auVar60._8_4_ = fVar138 * fVar48;
                auVar60._12_4_ = fVar139 * fVar49;
                auVar70._0_4_ = fVar130 * fVar140;
                auVar70._4_4_ = fVar131 * fVar143;
                auVar70._8_4_ = fVar132 * fVar144;
                auVar70._12_4_ = fVar133 * fVar145;
                auVar81 = vsubps_avx(auVar60,auVar70);
                auVar104._0_4_ = fVar130 * fVar91;
                auVar104._4_4_ = fVar131 * fVar88;
                auVar104._8_4_ = fVar132 * fVar99;
                auVar104._12_4_ = fVar133 * fVar102;
                auVar93 = vsubps_avx(auVar104,auVar52);
                auVar107 = vandps_avx(auVar134,auVar70);
                auVar108 = vandps_avx(auVar134,auVar52);
                auVar107 = vcmpps_avx(auVar107,auVar108,1);
                local_1338 = vblendvps_avx(auVar93,auVar81,auVar107);
                auVar61._0_4_ = fVar86 * fVar91;
                auVar61._4_4_ = fVar90 * fVar88;
                auVar61._8_4_ = fVar100 * fVar99;
                auVar61._12_4_ = fVar115 * fVar102;
                auVar71._0_4_ = fVar86 * fVar140;
                auVar71._4_4_ = fVar90 * fVar143;
                auVar71._8_4_ = fVar100 * fVar144;
                auVar71._12_4_ = fVar115 * fVar145;
                auVar97._0_4_ = fVar146 * fVar135;
                auVar97._4_4_ = fVar147 * fVar137;
                auVar97._8_4_ = fVar148 * fVar138;
                auVar97._12_4_ = fVar149 * fVar139;
                auVar105._0_4_ = fVar135 * fVar116;
                auVar105._4_4_ = fVar137 * fVar122;
                auVar105._8_4_ = fVar138 * fVar124;
                auVar105._12_4_ = fVar139 * fVar126;
                auVar81 = vsubps_avx(auVar71,auVar97);
                auVar93 = vsubps_avx(auVar105,auVar61);
                auVar107 = vandps_avx(auVar134,auVar97);
                auVar108 = vandps_avx(auVar134,auVar61);
                auVar107 = vcmpps_avx(auVar107,auVar108,1);
                local_1328 = vblendvps_avx(auVar93,auVar81,auVar107);
                fVar64 = fVar84 * local_1348._0_4_ +
                         local_1338._0_4_ * local_1598._4_4_ + local_1328._0_4_ * fVar78;
                fVar86 = fVar84 * local_1348._4_4_ +
                         local_1338._4_4_ * local_1598._4_4_ + local_1328._4_4_ * fVar78;
                fVar88 = fVar84 * local_1348._8_4_ +
                         local_1338._8_4_ * local_1598._4_4_ + local_1328._8_4_ * fVar78;
                fVar78 = fVar84 * local_1348._12_4_ +
                         local_1338._12_4_ * local_1598._4_4_ + local_1328._12_4_ * fVar78;
                auVar98._0_4_ = fVar64 + fVar64;
                auVar98._4_4_ = fVar86 + fVar86;
                auVar98._8_4_ = fVar88 + fVar88;
                auVar98._12_4_ = fVar78 + fVar78;
                fVar65 = local_1348._0_4_ * fVar65 +
                         local_1338._0_4_ * fVar11 + local_1328._0_4_ * fVar12;
                fVar73 = local_1348._4_4_ * fVar77 +
                         local_1338._4_4_ * fVar73 + local_1328._4_4_ * fVar75;
                fVar75 = local_1348._8_4_ * fVar15 +
                         local_1338._8_4_ * fVar13 + local_1328._8_4_ * fVar14;
                fVar77 = local_1348._12_4_ * fVar18 +
                         local_1338._12_4_ * fVar16 + local_1328._12_4_ * fVar17;
                auVar107 = vrcpps_avx(auVar98);
                fVar78 = auVar107._0_4_;
                auVar112._0_4_ = auVar98._0_4_ * fVar78;
                fVar84 = auVar107._4_4_;
                auVar112._4_4_ = auVar98._4_4_ * fVar84;
                fVar11 = auVar107._8_4_;
                auVar112._8_4_ = auVar98._8_4_ * fVar11;
                fVar12 = auVar107._12_4_;
                auVar112._12_4_ = auVar98._12_4_ * fVar12;
                auVar120._8_4_ = 0x3f800000;
                auVar120._0_8_ = &DAT_3f8000003f800000;
                auVar120._12_4_ = 0x3f800000;
                auVar107 = vsubps_avx(auVar120,auVar112);
                local_1358._0_4_ = (fVar65 + fVar65) * (fVar78 + fVar78 * auVar107._0_4_);
                local_1358._4_4_ = (fVar73 + fVar73) * (fVar84 + fVar84 * auVar107._4_4_);
                local_1358._8_4_ = (fVar75 + fVar75) * (fVar11 + fVar11 * auVar107._8_4_);
                local_1358._12_4_ = (fVar77 + fVar77) * (fVar12 + fVar12 * auVar107._12_4_);
                uVar38 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar106._4_4_ = uVar38;
                auVar106._0_4_ = uVar38;
                auVar106._8_4_ = uVar38;
                auVar106._12_4_ = uVar38;
                auVar107 = vcmpps_avx(auVar106,local_1358,2);
                fVar78 = ray->tfar;
                auVar113._4_4_ = fVar78;
                auVar113._0_4_ = fVar78;
                auVar113._8_4_ = fVar78;
                auVar113._12_4_ = fVar78;
                auVar108 = vcmpps_avx(local_1358,auVar113,2);
                auVar107 = vandps_avx(auVar107,auVar108);
                auVar108 = vcmpps_avx(auVar98,_DAT_01feba10,4);
                auVar107 = vandps_avx(auVar108,auVar107);
                auVar92 = vandps_avx(auVar92,auVar29);
                auVar107 = vpslld_avx(auVar107,0x1f);
                auVar108 = vpsrad_avx(auVar107,0x1f);
                auVar107 = auVar92 & auVar108;
                if ((((auVar107 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar107 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar107 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar107[0xf] < '\0') {
                  local_1388 = vandps_avx(auVar108,auVar92);
                  local_13c8 = local_15a8;
                  auVar92 = vrcpps_avx(local_13a8);
                  fVar78 = auVar92._0_4_;
                  auVar53._0_4_ = local_13a8._0_4_ * fVar78;
                  fVar84 = auVar92._4_4_;
                  auVar53._4_4_ = local_13a8._4_4_ * fVar84;
                  fVar11 = auVar92._8_4_;
                  auVar53._8_4_ = local_13a8._8_4_ * fVar11;
                  fVar12 = auVar92._12_4_;
                  auVar53._12_4_ = local_13a8._12_4_ * fVar12;
                  auVar62._8_4_ = 0x3f800000;
                  auVar62._0_8_ = &DAT_3f8000003f800000;
                  auVar62._12_4_ = 0x3f800000;
                  auVar92 = vsubps_avx(auVar62,auVar53);
                  auVar45._0_4_ = fVar78 + fVar78 * auVar92._0_4_;
                  auVar45._4_4_ = fVar84 + fVar84 * auVar92._4_4_;
                  auVar45._8_4_ = fVar11 + fVar11 * auVar92._8_4_;
                  auVar45._12_4_ = fVar12 + fVar12 * auVar92._12_4_;
                  auVar54._8_4_ = 0x219392ef;
                  auVar54._0_8_ = 0x219392ef219392ef;
                  auVar54._12_4_ = 0x219392ef;
                  auVar80 = vcmpps_avx(auVar80,auVar54,5);
                  auVar80 = vandps_avx(auVar80,auVar45);
                  auVar55._0_4_ = local_15a8._0_4_ * auVar80._0_4_;
                  auVar55._4_4_ = local_15a8._4_4_ * auVar80._4_4_;
                  auVar55._8_4_ = local_15a8._8_4_ * auVar80._8_4_;
                  auVar55._12_4_ = local_15a8._12_4_ * auVar80._12_4_;
                  local_1378 = vminps_avx(auVar55,auVar62);
                  auVar46._0_4_ = local_13b8._0_4_ * auVar80._0_4_;
                  auVar46._4_4_ = local_13b8._4_4_ * auVar80._4_4_;
                  auVar46._8_4_ = local_13b8._8_4_ * auVar80._8_4_;
                  auVar46._12_4_ = local_13b8._12_4_ * auVar80._12_4_;
                  local_1368 = vminps_avx(auVar46,auVar62);
                  uVar38 = vmovmskps_avx(local_1388);
                  uVar39 = CONCAT44((int)(uVar39 >> 0x20),uVar38);
                  do {
                    uVar36 = 0;
                    if (uVar39 != 0) {
                      for (; (uVar39 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                      }
                    }
                    h.geomID = *(uint *)((long)&local_13d8 + uVar36 * 4);
                    pGVar9 = (pSVar3->geometries).items[h.geomID].ptr;
                    if ((pGVar9->mask & ray->mask) == 0) {
                      uVar39 = uVar39 ^ 1L << (uVar36 & 0x3f);
                      bVar28 = true;
                    }
                    else {
                      pRVar10 = context->args;
                      if ((pRVar10->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar28 = false;
                      }
                      else {
                        h.u = *(float *)(local_1378 + uVar36 * 4);
                        h.v = *(float *)(local_1368 + uVar36 * 4);
                        args.context = context->user;
                        h.primID = *(uint *)((long)&local_13e8 + uVar36 * 4);
                        h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_1348 + uVar36 * 4);
                        h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_1338 + uVar36 * 4);
                        h.Ng.field_0.field_0.z = (float)*(undefined4 *)(local_1328 + uVar36 * 4);
                        h.instID[0] = (args.context)->instID[0];
                        h.instPrimID[0] = (args.context)->instPrimID[0];
                        fVar78 = ray->tfar;
                        ray->tfar = *(float *)(local_1358 + uVar36 * 4);
                        local_15ac = -1;
                        args.valid = &local_15ac;
                        args.geometryUserPtr = pGVar9->userPtr;
                        args.hit = (RTCHitN *)&h;
                        args.N = 1;
                        args.ray = (RTCRayN *)ray;
                        if (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00306512:
                          if (pRVar10->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar10->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                              (*pRVar10->filter)(&args);
                            }
                            if (*args.valid == 0) goto LAB_0030656a;
                          }
                          bVar28 = false;
                        }
                        else {
                          local_1598 = context;
                          local_15a8._0_8_ = ray;
                          (*pGVar9->occlusionFilterN)(&args);
                          ray = (Ray *)local_15a8._0_8_;
                          context = local_1598;
                          if (*args.valid != 0) goto LAB_00306512;
LAB_0030656a:
                          ray->tfar = fVar78;
                          uVar39 = uVar39 ^ 1L << (uVar36 & 0x3f);
                          bVar28 = true;
                        }
                      }
                    }
                    iVar35 = 0;
                    if (!bVar28) {
                      uVar36 = local_1550;
                      uVar37 = local_1558;
                      uVar33 = local_1570;
                      uVar40 = local_1560;
                      uVar41 = local_1568;
                      if (bVar42) {
                        ray->tfar = -INFINITY;
                        iVar35 = 3;
                      }
                      goto LAB_003065f4;
                    }
                  } while (uVar39 != 0);
                  uVar39 = 0;
                }
              }
              iVar35 = 0;
              local_1540 = local_1540 + 1;
              bVar42 = local_1540 < local_1548;
              uVar36 = local_1550;
              uVar37 = local_1558;
              uVar33 = local_1570;
              uVar40 = local_1560;
              uVar41 = local_1568;
            } while (local_1540 != local_1548);
          }
        }
LAB_003065f4:
        uVar39 = uVar33;
      } while (iVar35 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }